

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O0

int DTLSv1_handle_timeout(SSL *ssl)

{
  undefined1 auVar1 [12];
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  pointer ctx;
  BIO *bp;
  long lVar6;
  OPENSSL_timeval now_00;
  OPENSSL_timeval OVar7;
  long mtu;
  bool local_29;
  bool any_timer_expired;
  OPENSSL_timeval now;
  SSL *ssl_local;
  
  bssl::ssl_reset_error_state(ssl);
  iVar3 = SSL_is_dtls(ssl);
  if (iVar3 == 0) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_lib.cc"
                  ,0xbe);
    ssl_local._4_4_ = -1;
  }
  else {
    bVar2 = bssl::DTLSTimer::IsSet(&ssl->d1->ack_timer);
    if ((bVar2) || (bVar2 = bssl::DTLSTimer::IsSet(&ssl->d1->retransmit_timer), bVar2)) {
      ctx = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&ssl->ctx);
      OVar7 = bssl::ssl_ctx_get_current_time(ctx);
      auVar1 = OVar7._0_12_;
      OVar7._12_4_ = 0;
      OVar7.tv_sec = auVar1._0_8_;
      OVar7.tv_usec = auVar1._8_4_;
      local_29 = bssl::DTLSTimer::IsExpired(&ssl->d1->ack_timer,OVar7);
      if (local_29) {
        *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xffbf | 0x40;
        bssl::DTLSTimer::Stop(&ssl->d1->ack_timer);
      }
      now_00._12_4_ = 0;
      now_00.tv_sec = auVar1._0_8_;
      now_00.tv_usec = auVar1._8_4_;
      bVar2 = bssl::DTLSTimer::IsExpired(&ssl->d1->retransmit_timer,now_00);
      if (bVar2) {
        local_29 = true;
        *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xffdf | 0x20;
        bssl::DTLSTimer::Stop(&ssl->d1->retransmit_timer);
        ssl->d1->num_timeouts = ssl->d1->num_timeouts + 1;
        if ((2 < ssl->d1->num_timeouts) && (uVar4 = SSL_get_options(ssl), (uVar4 & 0x1000) == 0)) {
          bp = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&ssl->wbio);
          lVar6 = BIO_ctrl(bp,0x2f,0,(void *)0x0);
          if ((-1 < lVar6) && (lVar6 < 0x40000001)) {
            uVar5 = bssl::dtls1_min_mtu();
            if (uVar5 <= (uint)lVar6) {
              ssl->d1->mtu = (uint)lVar6;
            }
          }
        }
      }
      if (local_29 == false) {
        ssl_local._4_4_ = 0;
      }
      else {
        ssl_local._4_4_ = bssl::dtls1_flush(ssl);
      }
    }
    else {
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int DTLSv1_handle_timeout(SSL *ssl) {
  ssl_reset_error_state(ssl);

  if (!SSL_is_dtls(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return -1;
  }

  if (!ssl->d1->ack_timer.IsSet() && !ssl->d1->retransmit_timer.IsSet()) {
    // No timers are running. Don't bother querying the clock.
    return 0;
  }

  OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
  bool any_timer_expired = false;
  if (ssl->d1->ack_timer.IsExpired(now)) {
    any_timer_expired = true;
    ssl->d1->sending_ack = true;
    ssl->d1->ack_timer.Stop();
  }

  if (ssl->d1->retransmit_timer.IsExpired(now)) {
    any_timer_expired = true;
    ssl->d1->sending_flight = true;
    ssl->d1->retransmit_timer.Stop();

    ssl->d1->num_timeouts++;
    // Reduce MTU after 2 unsuccessful retransmissions.
    if (ssl->d1->num_timeouts > DTLS1_MTU_TIMEOUTS &&
        !(SSL_get_options(ssl) & SSL_OP_NO_QUERY_MTU)) {
      long mtu = BIO_ctrl(ssl->wbio.get(), BIO_CTRL_DGRAM_GET_FALLBACK_MTU, 0,
                          nullptr);
      if (mtu >= 0 && mtu <= (1 << 30) && (unsigned)mtu >= dtls1_min_mtu()) {
        ssl->d1->mtu = (unsigned)mtu;
      }
    }
  }

  if (!any_timer_expired) {
    return 0;
  }

  return dtls1_flush(ssl);
}